

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.h
# Opt level: O0

void xLearn::AccMetric::acc_accum_thread
               (vector<float,_std::allocator<float>_> *Y,vector<float,_std::allocator<float>_> *pred
               ,index_t *true_pred,size_t start_idx,size_t end_idx)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  ostream *poVar4;
  const_reference pvVar5;
  ulong in_RCX;
  int *in_RDX;
  vector<float,_std::allocator<float>_> *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  ulong in_R8;
  real_t r_label;
  real_t p_label;
  size_t i;
  string *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff74;
  string *in_stack_ffffffffffffff78;
  LogSeverity in_stack_ffffffffffffff84;
  allocator local_51;
  string local_50 [36];
  Logger local_2c;
  ulong local_28;
  ulong local_20;
  int *local_18;
  vector<float,_std::allocator<float>_> *local_10;
  vector<float,_std::allocator<float>_> *local_8;
  
  local_28 = in_R8;
  if (in_R8 < in_RCX) {
    local_20 = in_RCX;
    Logger::Logger(&local_2c,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/metric.h"
               ,&local_51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff78,"acc_accum_thread",
               (allocator *)&stack0xffffffffffffff77);
    poVar3 = Logger::Start(in_stack_ffffffffffffff84,in_stack_ffffffffffffff78,
                           in_stack_ffffffffffffff74,in_stack_ffffffffffffff68);
    poVar3 = std::operator<<(poVar3,"CHECK_GE failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/iamrinni[P]xlearn/src/loss/metric.h"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x76);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"end_idx");
    poVar3 = std::operator<<(poVar3," = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_28);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar4 = std::operator<<(poVar3,"start_idx");
    poVar4 = std::operator<<(poVar4," = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_20);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    Logger::~Logger((Logger *)poVar3);
    abort();
  }
  *in_RDX = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (; in_RCX < local_28; in_RCX = in_RCX + 1) {
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](local_10,in_RCX);
    iVar1 = -1;
    if (0.0 < *pvVar5) {
      iVar1 = 1;
    }
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](local_8,in_RCX);
    iVar2 = -1;
    if (0.0 < *pvVar5) {
      iVar2 = 1;
    }
    if (((float)iVar1 == (float)iVar2) && (!NAN((float)iVar1) && !NAN((float)iVar2))) {
      *local_18 = *local_18 + 1;
    }
  }
  return;
}

Assistant:

static void acc_accum_thread(const std::vector<real_t>* Y,
                               const std::vector<real_t>* pred,
                               index_t* true_pred,
                               size_t start_idx,
                               size_t end_idx) {
    CHECK_GE(end_idx, start_idx);
    *true_pred = 0;
    for (size_t i = start_idx; i < end_idx; ++i) {
      real_t p_label = (*pred)[i] > 0 ? 1 : -1;
      real_t r_label = (*Y)[i] > 0 ? 1 : -1;
      if (p_label == r_label) {
        (*true_pred)++;
      }
    }
  }